

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pdrInv.c
# Opt level: O1

Vec_Int_t * Pdr_ManCountFlops(Pdr_Man_t *p,Vec_Ptr_t *vCubes)

{
  int iVar1;
  uint uVar2;
  Aig_Man_t *pAVar3;
  void **ppvVar4;
  void *pvVar5;
  Vec_Int_t *pVVar6;
  int *__s;
  int iVar7;
  long lVar8;
  long lVar9;
  
  pAVar3 = p->pAig;
  iVar1 = pAVar3->nRegs;
  pVVar6 = (Vec_Int_t *)malloc(0x10);
  iVar7 = 0x10;
  if (0xe < iVar1 - 1U) {
    iVar7 = iVar1;
  }
  pVVar6->nSize = 0;
  pVVar6->nCap = iVar7;
  if (iVar7 == 0) {
    __s = (int *)0x0;
  }
  else {
    __s = (int *)malloc((long)iVar7 << 2);
  }
  pVVar6->pArray = __s;
  pVVar6->nSize = iVar1;
  if (__s != (int *)0x0) {
    memset(__s,0,(long)iVar1 << 2);
  }
  iVar7 = vCubes->nSize;
  if (0 < (long)iVar7) {
    ppvVar4 = vCubes->pArray;
    lVar8 = 0;
    do {
      pvVar5 = ppvVar4[lVar8];
      if ((*(int *)((long)pvVar5 + 8) != -1) && (0 < *(int *)((long)pvVar5 + 0x10))) {
        lVar9 = 0;
        do {
          uVar2 = *(uint *)((long)pvVar5 + lVar9 * 4 + 0x14);
          if (((int)uVar2 < 0) || (pAVar3->nRegs * 2 <= (int)uVar2)) {
            __assert_fail("pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig)",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/proof/pdr/pdrInv.c"
                          ,0x82,"Vec_Int_t *Pdr_ManCountFlops(Pdr_Man_t *, Vec_Ptr_t *)");
          }
          if (iVar1 <= (int)(uVar2 >> 1)) {
            __assert_fail("i >= 0 && i < p->nSize",
                          "/workspace/llm4binary/github/license_all_cmakelists_25/Runnlion[P]LSV-PA/src/misc/vec/vecInt.h"
                          ,0x1dc,"int Vec_IntAddToEntry(Vec_Int_t *, int, int)");
          }
          __s[uVar2 >> 1] = __s[uVar2 >> 1] + 1;
          lVar9 = lVar9 + 1;
        } while (lVar9 < *(int *)((long)pvVar5 + 0x10));
      }
      lVar8 = lVar8 + 1;
    } while (lVar8 != iVar7);
  }
  return pVVar6;
}

Assistant:

Vec_Int_t * Pdr_ManCountFlops( Pdr_Man_t * p, Vec_Ptr_t * vCubes )
{
    Vec_Int_t * vFlopCount;
    Pdr_Set_t * pCube;
    int i, n;
    vFlopCount = Vec_IntStart( Aig_ManRegNum(p->pAig) );
    Vec_PtrForEachEntry( Pdr_Set_t *, vCubes, pCube, i )
    {
        if ( pCube->nRefs == -1 )
            continue;
        for ( n = 0; n < pCube->nLits; n++ )
        {
            assert( pCube->Lits[n] >= 0 && pCube->Lits[n] < 2*Aig_ManRegNum(p->pAig) );
            Vec_IntAddToEntry( vFlopCount, pCube->Lits[n] >> 1, 1 );
        }
    }
    return vFlopCount;
}